

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckCommand.cxx
# Opt level: O3

cmCTestTestHandler * __thiscall
cmCTestMemCheckCommand::InitializeActualHandler(cmCTestMemCheckCommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  cmCTest *pcVar3;
  cmCTestMemCheckHandler *pcVar4;
  string local_48;
  
  pcVar4 = cmCTest::GetMemCheckHandler
                     ((this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.
                      super_cmCTestCommand.CTest);
  (*(pcVar4->super_cmCTestTestHandler).super_cmCTestGenericHandler._vptr_cmCTestGenericHandler[3])
            (pcVar4);
  pcVar2 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.
           super_cmCommand.Makefile;
  pcVar3 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.CTest;
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"CTEST_MEMORYCHECK_TYPE","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar3,pcVar2,"MemoryCheckType",&local_48,
             (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.
           super_cmCommand.Makefile;
  pcVar3 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.CTest;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"CTEST_MEMORYCHECK_SANITIZER_OPTIONS","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar3,pcVar2,"MemoryCheckSanitizerOptions",&local_48,
             (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.
           super_cmCommand.Makefile;
  pcVar3 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.CTest;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"CTEST_MEMORYCHECK_COMMAND","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar3,pcVar2,"MemoryCheckCommand",&local_48,
             (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.
           super_cmCommand.Makefile;
  pcVar3 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.CTest;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"CTEST_MEMORYCHECK_COMMAND_OPTIONS","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar3,pcVar2,"MemoryCheckCommandOptions",&local_48,
             (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.
           super_cmCommand.Makefile;
  pcVar3 = (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.super_cmCTestCommand.CTest;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"CTEST_MEMORYCHECK_SUPPRESSIONS_FILE","");
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar3,pcVar2,"MemoryCheckSuppressionFile",&local_48,
             (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  (pcVar4->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet =
       (this->super_cmCTestTestCommand).super_cmCTestHandlerCommand.Quiet;
  return &pcVar4->super_cmCTestTestHandler;
}

Assistant:

cmCTestTestHandler* cmCTestMemCheckCommand::InitializeActualHandler()
{
  cmCTestMemCheckHandler* handler = this->CTest->GetMemCheckHandler();
  handler->Initialize();

  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "MemoryCheckType", "CTEST_MEMORYCHECK_TYPE", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "MemoryCheckSanitizerOptions",
    "CTEST_MEMORYCHECK_SANITIZER_OPTIONS", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "MemoryCheckCommand", "CTEST_MEMORYCHECK_COMMAND",
    this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "MemoryCheckCommandOptions",
    "CTEST_MEMORYCHECK_COMMAND_OPTIONS", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "MemoryCheckSuppressionFile",
    "CTEST_MEMORYCHECK_SUPPRESSIONS_FILE", this->Quiet);

  handler->SetQuiet(this->Quiet);
  return handler;
}